

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::ForStmt::clone(ForStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<kratos::Stmt> local_68 [2];
  shared_ptr<kratos::Stmt> local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  shared_ptr<kratos::ForStmt> stmt;
  ForStmt *this_local;
  
  stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  peVar1 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(__fn + 0xc0));
  std::make_shared<kratos::ForStmt,std::__cxx11::string&,long_const&,long_const&,long_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
             (long *)&(peVar1->super_Var).name,(long *)(__fn + 0xd0),(long *)(__fn + 0xd8));
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(__fn + 0xe8));
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xb])(&local_48);
  std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_48);
  Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_38);
  peVar3 = std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  std::shared_ptr<kratos::ScopedStmtBlock>::operator=
            (&peVar3->loop_body_,(shared_ptr<kratos::ScopedStmtBlock> *)local_38);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)local_38);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_48);
  peVar3 = std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar3->loop_body_);
  peVar4 = std::__shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,peVar4);
  peVar3 = std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  std::shared_ptr<kratos::IterVar>::operator=
            (&peVar3->iter_,(shared_ptr<kratos::IterVar> *)(__fn + 0xc0));
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ForStmt,void>
            (local_68,(shared_ptr<kratos::ForStmt> *)local_28);
  Stmt::copy_meta((Stmt *)__fn,local_68);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(local_68);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ForStmt,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::ForStmt> *)local_28);
  std::shared_ptr<kratos::ForStmt>::~shared_ptr((shared_ptr<kratos::ForStmt> *)local_28);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> ForStmt::clone() const {
    auto stmt = std::make_shared<ForStmt>(iter_->name, start_, end_, step_);
    stmt->loop_body_ = loop_body_->clone()->as<ScopedStmtBlock>();
    stmt->loop_body_->set_parent(stmt.get());
    // share the iter expression
    stmt->iter_ = iter_;
    copy_meta(stmt);
    return stmt;
}